

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseInterpolationExpr(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  unique_ptr<enact::InterpolationExpr,_std::default_delete<enact::InterpolationExpr>_> local_b0;
  undefined1 local_a8 [16];
  string local_98;
  undefined1 local_78 [8];
  undefined1 local_70 [8];
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> end;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> interpolated;
  undefined1 local_50 [8];
  unique_ptr<enact::StringExpr,_std::default_delete<enact::StringExpr>_> start;
  Token token;
  Parser *this_local;
  
  Token::Token((Token *)&start,&in_RSI->m_previous);
  std::make_unique<enact::StringExpr,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  parseExpr((Parser *)&end);
  std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
  unique_ptr<std::default_delete<enact::Expr>,void>
            ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)local_70);
  bVar1 = consume(in_RSI,INTERPOLATION);
  if (bVar1) {
    parseInterpolationExpr((Parser *)local_78);
    std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::operator=
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_70,
               (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_78);
    std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_78);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Expected end of string interpolation",
               (allocator<char> *)(local_a8 + 0xf));
    expect(in_RSI,STRING,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)(local_a8 + 0xf));
    std::make_unique<enact::StringExpr,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::operator=
              ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)local_70,
               (unique_ptr<enact::StringExpr,_std::default_delete<enact::StringExpr>_> *)local_a8);
    std::unique_ptr<enact::StringExpr,_std::default_delete<enact::StringExpr>_>::~unique_ptr
              ((unique_ptr<enact::StringExpr,_std::default_delete<enact::StringExpr>_> *)local_a8);
  }
  std::
  make_unique<enact::InterpolationExpr,std::unique_ptr<enact::StringExpr,std::default_delete<enact::StringExpr>>,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token>
            ((unique_ptr<enact::StringExpr,_std::default_delete<enact::StringExpr>_> *)&local_b0,
             (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_50,&end,
             (Token *)local_70);
  std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::
  unique_ptr<enact::InterpolationExpr,std::default_delete<enact::InterpolationExpr>,void>
            ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,&local_b0);
  std::unique_ptr<enact::InterpolationExpr,_std::default_delete<enact::InterpolationExpr>_>::
  ~unique_ptr(&local_b0);
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
            ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_70);
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr(&end);
  std::unique_ptr<enact::StringExpr,_std::default_delete<enact::StringExpr>_>::~unique_ptr
            ((unique_ptr<enact::StringExpr,_std::default_delete<enact::StringExpr>_> *)local_50);
  Token::~Token((Token *)&start);
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseInterpolationExpr() {
        Token token = m_previous;
        std::unique_ptr<StringExpr> start = std::make_unique<StringExpr>(m_previous.lexeme);
        std::unique_ptr<Expr> interpolated = parseExpr();
        std::unique_ptr<Expr> end;

        if (consume(TokenType::INTERPOLATION)) {
            end = parseInterpolationExpr();
        } else {
            expect(TokenType::STRING, "Expected end of string interpolation");
            end = std::make_unique<StringExpr>(m_previous.lexeme);
        }

        return std::make_unique<InterpolationExpr>(
                std::move(start),
                std::move(interpolated),
                std::move(end),
                std::move(token));
    }